

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_disable(InstanceBuilder *this,VkValidationCheckEXT check)

{
  iterator __position;
  VkValidationCheckEXT local_c;
  
  __position._M_current =
       (this->info).disabled_validation_checks.
       super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->info).disabled_validation_checks.
      super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_c = check;
    std::vector<VkValidationCheckEXT,std::allocator<VkValidationCheckEXT>>::
    _M_realloc_insert<VkValidationCheckEXT_const&>
              ((vector<VkValidationCheckEXT,std::allocator<VkValidationCheckEXT>> *)
               &(this->info).disabled_validation_checks,__position,&local_c);
  }
  else {
    *__position._M_current = check;
    (this->info).disabled_validation_checks.
    super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_disable(VkValidationCheckEXT check) {
    info.disabled_validation_checks.push_back(check);
    return *this;
}